

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O2

_Bool DUI_Checkbox(char *text,_Bool *checked)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  SDL_Rect bounds;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  sVar2 = strlen(text);
  bVar3 = _duiClicked;
  bounds.w = ((int)sVar2 + 2) * _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  bounds.h = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  bounds.x = _duiCursor.x;
  bounds.y = _duiCursor.y;
  if (((_duiMouse.x < _duiCursor.x) || (_duiCursor.x + bounds.w <= _duiMouse.x)) ||
     (bounds.h + _duiCursor.y <= _duiMouse.y || _duiMouse.y < _duiCursor.y)) {
    DUI_setColorDefault();
    bVar3 = 0;
  }
  else {
    DUI_setColorHover();
  }
  SDL_RenderFillRect(_duiRenderer,&bounds);
  DUI_setColorBorder();
  SDL_RenderDrawRect(_duiRenderer,&bounds);
  local_38 = bounds.x + _duiStyle.CharSize;
  iStack_34 = _duiStyle.CharSize / 2 + bounds.y;
  iStack_30 = _duiStyle.CharSize;
  iStack_2c = _duiStyle.CharSize;
  SDL_RenderDrawRect(_duiRenderer,&local_38,(long)_duiStyle.CharSize % 2 & 0xffffffff);
  bVar1 = *checked;
  if ((bVar3 & 1) != 0) {
    bVar1 = bVar1 ^ 1;
    *checked = (_Bool)bVar1;
  }
  if ((bVar1 & 1) != 0) {
    local_38 = local_38 + 1;
    iStack_34 = iStack_34 + 1;
    iStack_30 = iStack_30 + -2;
    iStack_2c = iStack_2c + -2;
    SDL_RenderFillRect(_duiRenderer);
  }
  _duiCursor.x = _duiCursor.x + _duiStyle.ButtonPadding + _duiStyle.CharSize * 2;
  _duiCursor.y = _duiCursor.y + _duiStyle.ButtonPadding;
  DUI_Print("%s",text);
  _duiCursor.x = bounds.w + bounds.x + _duiStyle.ButtonMargin;
  _duiCursor.y = bounds.y;
  return *checked;
}

Assistant:

bool DUI_Checkbox(const char * text, bool * checked)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.CharSize * 2)
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    SDL_Rect mark = { 
        .x = bounds.x + _duiStyle.CharSize,
        .y = bounds.y + (_duiStyle.CharSize / 2),
        .w = _duiStyle.CharSize,
        .h = _duiStyle.CharSize,
    };

    SDL_RenderDrawRect(_duiRenderer, &mark);

    if (clicked) {
        *checked ^= true;
    }

    if (*checked) {
        ++mark.x;
        ++mark.y;
        mark.w -= 2;
        mark.h -= 2;

        SDL_RenderFillRect(_duiRenderer, &mark);
    }

    _duiCursor.x += _duiStyle.ButtonPadding + (_duiStyle.CharSize * 2);
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return *checked;
}